

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gnuplot-iostream.h
# Opt level: O1

void __thiscall gnuplotio::GnuplotTmpfile::GnuplotTmpfile(GnuplotTmpfile *this,bool _debug_messages)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  pointer pcVar4;
  basic_ostream<char,_std::char_traits<char>_> *pbVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  path local_68;
  path local_48;
  
  boost::filesystem::detail::temp_directory_path((error_code *)&local_68);
  paVar1 = &local_48.m_pathname.field_2;
  local_48.m_pathname._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_48,"tmp-gnuplot-%%%%-%%%%-%%%%-%%%%","");
  boost::filesystem::path::operator/=(&local_68,&local_48);
  paVar2 = &local_88.field_2;
  paVar3 = &local_68.m_pathname.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_pathname._M_dataplus._M_p == paVar3) {
    local_88.field_2._8_8_ = local_68.m_pathname.field_2._8_8_;
    local_88._M_dataplus._M_p = (pointer)paVar2;
  }
  else {
    local_88._M_dataplus._M_p = local_68.m_pathname._M_dataplus._M_p;
  }
  local_88.field_2._M_allocated_capacity._1_7_ =
       local_68.m_pathname.field_2._M_allocated_capacity._1_7_;
  local_88.field_2._M_local_buf[0] = local_68.m_pathname.field_2._M_local_buf[0];
  local_88._M_string_length = local_68.m_pathname._M_string_length;
  local_68.m_pathname._M_string_length = 0;
  local_68.m_pathname.field_2._M_local_buf[0] = '\0';
  local_68.m_pathname._M_dataplus._M_p = (pointer)paVar3;
  boost::filesystem::detail::unique_path(&this->file,(error_code *)&local_88);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_88._M_dataplus._M_p != paVar2) {
    operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48.m_pathname._M_dataplus._M_p != paVar1) {
    operator_delete(local_48.m_pathname._M_dataplus._M_p,
                    local_48.m_pathname.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.m_pathname._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.m_pathname._M_dataplus._M_p,
                    CONCAT71(local_68.m_pathname.field_2._M_allocated_capacity._1_7_,
                             local_68.m_pathname.field_2._M_local_buf[0]) + 1);
  }
  this->debug_messages = _debug_messages;
  if (_debug_messages) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"create tmpfile ",0xf);
    pcVar4 = (this->file).m_pathname._M_dataplus._M_p;
    local_88._M_dataplus._M_p = (pointer)paVar2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_88,pcVar4,pcVar4 + (this->file).m_pathname._M_string_length);
    pbVar5 = boost::io::detail::quoted_out<char,std::char_traits<char>,std::__cxx11::string_const>
                       ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,&local_88,'&',
                        '\"');
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != paVar2) {
      operator_delete(local_88._M_dataplus._M_p,local_88.field_2._M_allocated_capacity + 1);
    }
    std::ios::widen((char)pbVar5->_vptr_basic_ostream[-3] + (char)pbVar5);
    std::ostream::put((char)pbVar5);
    std::ostream::flush();
  }
  return;
}

Assistant:

explicit GnuplotTmpfile(bool _debug_messages) :
        file(boost::filesystem::unique_path(
            boost::filesystem::temp_directory_path() /
            "tmp-gnuplot-%%%%-%%%%-%%%%-%%%%")),
        debug_messages(_debug_messages)
    {
        if(debug_messages) {
            std::cerr << "create tmpfile " << file << std::endl;
        }
    }